

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query_profiler.cpp
# Opt level: O3

string * __thiscall
duckdb::QueryProfiler::RenderDisabledMessage_abi_cxx11_
          (string *__return_storage_ptr__,QueryProfiler *this,ProfilerPrintFormat format)

{
  yyjson_val_pool *pool;
  yyjson_mut_val *pyVar1;
  bool bVar2;
  yyjson_mut_doc *this_00;
  InternalException *this_01;
  uint *object;
  undefined7 in_register_00000011;
  char *pcVar3;
  ulong uVar4;
  char *pcVar5;
  yyjson_mut_doc *doc;
  string local_68;
  string local_48;
  
  uVar4 = CONCAT71(in_register_00000011,format) & 0xffffffff;
  object = &switchD_016689d0::switchdataD_01e025f0;
  switch(uVar4) {
  case 0:
  case 2:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar5 = "Query profiling is disabled. Use \'PRAGMA enable_profiling;\' to enable profiling!";
    pcVar3 = "";
    break;
  case 1:
    doc = (yyjson_mut_doc *)0x0;
    this_00 = duckdb_yyjson::yyjson_mut_doc_new((yyjson_alc *)0x0);
    if (this_00 == (yyjson_mut_doc *)0x0) goto LAB_01668a77;
    pool = &this_00->val_pool;
    doc = (yyjson_mut_doc *)(this_00->val_pool).cur;
    if ((yyjson_mut_doc *)(this_00->val_pool).end == doc) {
      bVar2 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pool,&this_00->alc,1);
      if (bVar2) {
        doc = (yyjson_mut_doc *)pool->cur;
        goto LAB_01668a29;
      }
    }
    else {
LAB_01668a29:
      pool->cur = (yyjson_mut_val *)((yyjson_val_uni *)&doc->alc + 2);
      if (doc != (yyjson_mut_doc *)0x0) {
        doc->root = (yyjson_mut_val *)0x7;
        this_00->root = (yyjson_mut_val *)doc;
        object = (uint *)(((long)(this_00->val_pool).end - (long)((yyjson_val_uni *)&doc->alc + 2)
                          >> 3) * -0x5555555555555555);
        if (object < (yyjson_mut_val *)0x2) {
          bVar2 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pool,&this_00->alc,2);
          if ((!bVar2) ||
             (pyVar1 = pool->cur, pool->cur = pyVar1 + 2, pyVar1 == (yyjson_mut_val *)0x0))
          goto LAB_01668a77;
        }
        else {
          pool->cur = (yyjson_mut_val *)&(doc->str_pool).chunks;
        }
        RenderDisabledMessage_abi_cxx11_();
        goto LAB_01668a77;
      }
    }
    this_00->root = (yyjson_mut_val *)0x0;
    doc = (yyjson_mut_doc *)0x0;
LAB_01668a77:
    StringifyAndFree_abi_cxx11_
              (__return_storage_ptr__,(duckdb *)this_00,doc,(yyjson_mut_val *)object);
    return __return_storage_ptr__;
  case 3:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = anon_var_dwarf_4ed193b + 9;
    pcVar5 = anon_var_dwarf_4ed193b + 9;
    break;
  case 4:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar5 = 
    "\n\t\t\t\t<!DOCTYPE html>\n                <html lang=\"en\"><head/><body>\n                  Query profiling is disabled. Use \'PRAGMA enable_profiling;\' to enable profiling!\n                </body></html>\n\t\t\t"
    ;
    pcVar3 = "";
    break;
  case 5:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar5 = 
    "\n\t\t\t\tdigraph G {\n\t\t\t\t    node [shape=box, style=rounded, fontname=\"Courier New\", fontsize=10];\n\t\t\t\t    node_0_0 [label=\"Query profiling is disabled. Use \'PRAGMA enable_profiling;\' to enable profiling!\"];\n\t\t\t\t}\n\t\t\t"
    ;
    pcVar3 = "";
    break;
  default:
    this_01 = (InternalException *)__cxa_allocate_exception(0x10);
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"Unknown ProfilerPrintFormat \"%s\"","");
    EnumUtil::ToString<duckdb::ProfilerPrintFormat>(&local_48,(ProfilerPrintFormat)uVar4);
    InternalException::InternalException<std::__cxx11::string>(this_01,&local_68,&local_48);
    __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  ::std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar5,pcVar3);
  return __return_storage_ptr__;
}

Assistant:

string QueryProfiler::RenderDisabledMessage(ProfilerPrintFormat format) const {
	switch (format) {
	case ProfilerPrintFormat::NO_OUTPUT:
		return "";
	case ProfilerPrintFormat::QUERY_TREE:
	case ProfilerPrintFormat::QUERY_TREE_OPTIMIZER:
		return "Query profiling is disabled. Use 'PRAGMA enable_profiling;' to enable profiling!";
	case ProfilerPrintFormat::HTML:
		return R"(
				<!DOCTYPE html>
                <html lang="en"><head/><body>
                  Query profiling is disabled. Use 'PRAGMA enable_profiling;' to enable profiling!
                </body></html>
			)";
	case ProfilerPrintFormat::GRAPHVIZ:
		return R"(
				digraph G {
				    node [shape=box, style=rounded, fontname="Courier New", fontsize=10];
				    node_0_0 [label="Query profiling is disabled. Use 'PRAGMA enable_profiling;' to enable profiling!"];
				}
			)";
	case ProfilerPrintFormat::JSON: {
		auto doc = yyjson_mut_doc_new(nullptr);
		auto result_obj = yyjson_mut_obj(doc);
		yyjson_mut_doc_set_root(doc, result_obj);

		yyjson_mut_obj_add_str(doc, result_obj, "result", "disabled");
		return StringifyAndFree(doc, result_obj);
	}
	default:
		throw InternalException("Unknown ProfilerPrintFormat \"%s\"", EnumUtil::ToString(format));
	}
}